

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall
ImGuiInputTextCallbackData::InsertChars
          (ImGuiInputTextCallbackData *this,int pos,char *new_text,char *new_text_end)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  long in_RCX;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  bool bVar6;
  int new_buf_size;
  ImGuiInputTextState *edit_state;
  ImGuiContext *g;
  int new_text_len;
  bool is_resizable;
  int local_4c;
  undefined4 in_stack_ffffffffffffffc0;
  
  uVar1 = *(uint *)(in_RDI + 4);
  if (in_RCX == 0) {
    sVar5 = strlen(in_RDX);
    local_4c = (int)sVar5;
  }
  else {
    local_4c = (int)in_RCX - (int)in_RDX;
  }
  pIVar2 = GImGui;
  if (*(int *)(in_RDI + 0x24) <= local_4c + *(int *)(in_RDI + 0x20)) {
    if ((uVar1 & 0x40000) == 0) {
      return;
    }
    bVar6 = false;
    if ((GImGui->InputTextState).ID != 0) {
      bVar6 = GImGui->ActiveId == (GImGui->InputTextState).ID;
    }
    if (!bVar6) {
      __assert_fail("edit_state->ID != 0 && g.ActiveId == edit_state->ID",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0xd5e,
                    "void ImGuiInputTextCallbackData::InsertChars(int, const char *, const char *)")
      ;
    }
    if (*(char **)(in_RDI + 0x18) != (GImGui->InputTextState).TextA.Data) {
      __assert_fail("Buf == edit_state->TextA.Data",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0xd5f,
                    "void ImGuiInputTextCallbackData::InsertChars(int, const char *, const char *)")
      ;
    }
    iVar4 = *(int *)(in_RDI + 0x20);
    iVar3 = ImMax<int>(0x100,local_4c);
    iVar3 = ImClamp<int>(local_4c << 2,0x20,iVar3);
    iVar4 = iVar4 + iVar3 + 1;
    ImVector<char>::reserve
              ((ImVector<char> *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
               (int)((ulong)in_RDI >> 0x20));
    *(char **)(in_RDI + 0x18) = (pIVar2->InputTextState).TextA.Data;
    (pIVar2->InputTextState).BufCapacityA = iVar4;
    *(int *)(in_RDI + 0x24) = iVar4;
  }
  if (*(int *)(in_RDI + 0x20) != in_ESI) {
    memmove((void *)(*(long *)(in_RDI + 0x18) + (long)in_ESI + (long)local_4c),
            (void *)(*(long *)(in_RDI + 0x18) + (long)in_ESI),
            (long)(*(int *)(in_RDI + 0x20) - in_ESI));
  }
  memcpy((void *)(*(long *)(in_RDI + 0x18) + (long)in_ESI),in_RDX,(long)local_4c);
  *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(*(int *)(in_RDI + 0x20) + local_4c)) = 0;
  if (in_ESI <= *(int *)(in_RDI + 0x2c)) {
    *(int *)(in_RDI + 0x2c) = local_4c + *(int *)(in_RDI + 0x2c);
  }
  *(undefined4 *)(in_RDI + 0x34) = *(undefined4 *)(in_RDI + 0x2c);
  *(undefined4 *)(in_RDI + 0x30) = *(undefined4 *)(in_RDI + 0x2c);
  *(undefined1 *)(in_RDI + 0x28) = 1;
  *(int *)(in_RDI + 0x20) = local_4c + *(int *)(in_RDI + 0x20);
  return;
}

Assistant:

void ImGuiInputTextCallbackData::InsertChars(int pos, const char* new_text, const char* new_text_end)
{
    const bool is_resizable = (Flags & ImGuiInputTextFlags_CallbackResize) != 0;
    const int new_text_len = new_text_end ? (int)(new_text_end - new_text) : (int)strlen(new_text);
    if (new_text_len + BufTextLen >= BufSize)
    {
        if (!is_resizable)
            return;

        // Contrary to STB_TEXTEDIT_INSERTCHARS() this is working in the UTF8 buffer, hence the mildly similar code (until we remove the U16 buffer altogether!)
        ImGuiContext& g = *GImGui;
        ImGuiInputTextState* edit_state = &g.InputTextState;
        IM_ASSERT(edit_state->ID != 0 && g.ActiveId == edit_state->ID);
        IM_ASSERT(Buf == edit_state->TextA.Data);
        int new_buf_size = BufTextLen + ImClamp(new_text_len * 4, 32, ImMax(256, new_text_len)) + 1;
        edit_state->TextA.reserve(new_buf_size + 1);
        Buf = edit_state->TextA.Data;
        BufSize = edit_state->BufCapacityA = new_buf_size;
    }

    if (BufTextLen != pos)
        memmove(Buf + pos + new_text_len, Buf + pos, (size_t)(BufTextLen - pos));
    memcpy(Buf + pos, new_text, (size_t)new_text_len * sizeof(char));
    Buf[BufTextLen + new_text_len] = '\0';

    if (CursorPos >= pos)
        CursorPos += new_text_len;
    SelectionStart = SelectionEnd = CursorPos;
    BufDirty = true;
    BufTextLen += new_text_len;
}